

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O2

void __thiscall QDBusPlatformMenu::syncSubMenu(QDBusPlatformMenu *this,QDBusPlatformMenu *menu)

{
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  code *local_48;
  Data *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = propertiesUpdated;
  local_40 = (Data *)0x0;
  type = (ConnectionType)this;
  QObject::
  connect<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>),void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
            ((Object *)&stack0xffffffffffffffc8,(offset_in_QDBusPlatformMenu_to_subr)menu,
             (ContextType *)propertiesUpdated,(offset_in_QDBusPlatformMenu_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
  local_48 = updated;
  local_40 = (Data *)0x0;
  QObject::
  connect<void(QDBusPlatformMenu::*)(unsigned_int,int),void(QDBusPlatformMenu::*)(unsigned_int,int)>
            ((Object *)(local_58 + 8),(offset_in_QDBusPlatformMenu_to_subr)menu,
             (ContextType *)updated,(offset_in_QDBusPlatformMenu_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
  local_48 = popupRequested;
  local_40 = (Data *)0x0;
  QObject::
  connect<void(QDBusPlatformMenu::*)(int,unsigned_int),void(QDBusPlatformMenu::*)(int,unsigned_int)>
            ((Object *)local_58,(offset_in_QDBusPlatformMenu_to_subr)menu,
             (ContextType *)popupRequested,(offset_in_QDBusPlatformMenu_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncSubMenu(const QDBusPlatformMenu *menu)
{
    // The adaptor is only connected to the propertiesUpdated signal of the top-level
    // menu, so the submenus should transfer their signals to their parents.
    connect(menu, &QDBusPlatformMenu::propertiesUpdated,
            this, &QDBusPlatformMenu::propertiesUpdated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::updated,
            this, &QDBusPlatformMenu::updated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::popupRequested,
            this, &QDBusPlatformMenu::popupRequested, Qt::UniqueConnection);
}